

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  byte bVar1;
  ushort uVar2;
  u32 uVar3;
  Pgno newPgno;
  Pager *pPager;
  PgHdr *pPg;
  int iVar4;
  u32 uVar5;
  DbPage *p;
  ulong uVar6;
  BtShared *pBt_00;
  Pgno i;
  uint *puVar7;
  u8 *puVar8;
  int local_5c;
  BtShared *local_58;
  CellInfo local_50;
  MemPage *pPtrPage;
  
  uVar3 = pDbPage->pgno;
  pPager = pBt->pPager;
  pPg = pDbPage->pDbPage;
  local_58 = pBt;
  if ((pPager->tempFile != '\0') && (iVar4 = sqlite3PagerWrite(pPg), iVar4 != 0)) {
    return iVar4;
  }
  uVar2 = pPg->flags;
  if ((uVar2 & 2) != 0) {
    iVar4 = subjournalPageIfRequired(pPg);
    if (iVar4 != 0) {
      return iVar4;
    }
    uVar2 = pPg->flags;
  }
  i = 0;
  if ((isCommit == 0) && ((uVar2 & 8) != 0)) {
    i = pPg->pgno;
  }
  pPg->flags = uVar2 & 0xfff7;
  p = sqlite3PagerLookup(pPager,iFreePage);
  if (p != (DbPage *)0x0) {
    pPg->flags = pPg->flags | p->flags & 8;
    if (pPager->tempFile == '\0') {
      sqlite3PcacheDrop(p);
    }
    else {
      sqlite3PcacheMove(p,pPager->dbSize + 1);
    }
  }
  newPgno = pPg->pgno;
  sqlite3PcacheMove(pPg,iFreePage);
  sqlite3PcacheMakeDirty(pPg);
  if ((p != (DbPage *)0x0) && (pPager->tempFile != '\0')) {
    sqlite3PcacheMove(p,newPgno);
    sqlite3PagerUnrefNotNull(p);
  }
  if (i != 0) {
    iVar4 = (*pPager->xGet)(pPager,i,(DbPage **)&local_50,0);
    if (iVar4 != 0) {
      if (pPager->dbOrigSize < i) {
        return iVar4;
      }
      sqlite3BitvecClear(pPager->pInJournal,i,pPager->pTmpSpace);
      return iVar4;
    }
    *(u16 *)(local_50.nKey + 0x34) = *(u16 *)(local_50.nKey + 0x34) | 8;
    sqlite3PcacheMakeDirty((PgHdr *)local_50.nKey);
    sqlite3PagerUnrefNotNull((DbPage *)local_50.nKey);
  }
  local_5c = 0;
  pDbPage->pgno = iFreePage;
  if ((eType & 0xfb) == 1) {
    iVar4 = setChildPtrmaps(pDbPage);
    if (iVar4 != 0) {
      return iVar4;
    }
    pBt_00 = local_58;
    if (eType == '\x01') {
      return 0;
    }
  }
  else {
    uVar5 = sqlite3Get4byte(pDbPage->aData);
    pBt_00 = local_58;
    if ((uVar5 != 0) && (ptrmapPut(local_58,uVar5,'\x04',iFreePage,&local_5c), local_5c != 0)) {
      return local_5c;
    }
  }
  iVar4 = btreeGetPage(pBt_00,iPtrPage,&pPtrPage,0);
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = sqlite3PagerWrite(pPtrPage->pDbPage);
  if (iVar4 != 0) {
    releasePage(pPtrPage);
    return iVar4;
  }
  if (eType == '\x04') {
    puVar7 = (uint *)pPtrPage->aData;
    uVar5 = sqlite3Get4byte((u8 *)puVar7);
    if (uVar5 == uVar3) {
      *puVar7 = iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 | (iFreePage & 0xff00) << 8 |
                iFreePage << 0x18;
LAB_00142408:
      iVar4 = 0;
      goto LAB_0014254b;
    }
    iVar4 = 0x1027b;
  }
  else {
    if ((pPtrPage->isInit == '\0') && (iVar4 = btreeInitPage(pPtrPage), iVar4 != 0))
    goto LAB_0014254b;
    uVar2 = pPtrPage->nCell;
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      puVar7 = (uint *)(pPtrPage->aData +
                       (CONCAT11(pPtrPage->aCellIdx[uVar6 * 2],pPtrPage->aCellIdx[uVar6 * 2 + 1]) &
                       pPtrPage->maskPage));
      if (eType == '\x03') {
        (*pPtrPage->xParseCell)(pPtrPage,(u8 *)puVar7,&local_50);
        if (local_50.nLocal < local_50.nPayload) {
          puVar8 = (u8 *)((long)puVar7 + (ulong)local_50.nSize);
          if (pPtrPage->aData + pPtrPage->pBt->usableSize < puVar8) {
            iVar4 = sqlite3CorruptError(0x1028e);
            goto LAB_0014254b;
          }
          uVar5 = sqlite3Get4byte(puVar8 + -4);
          if (uVar5 == uVar3) {
            *(Pgno *)(puVar8 + -4) =
                 iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 | (iFreePage & 0xff00) << 8 |
                 iFreePage << 0x18;
            goto LAB_00142545;
          }
        }
      }
      else {
        uVar5 = sqlite3Get4byte((u8 *)puVar7);
        if (uVar5 == uVar3) {
          *puVar7 = iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 | (iFreePage & 0xff00) << 8 |
                    iFreePage << 0x18;
LAB_00142545:
          iVar4 = 0;
          goto LAB_0014254b;
        }
      }
    }
    if (eType == '\x05') {
      puVar8 = pPtrPage->aData;
      bVar1 = pPtrPage->hdrOffset;
      uVar5 = sqlite3Get4byte(puVar8 + (ulong)bVar1 + 8);
      if (uVar5 == uVar3) {
        *(Pgno *)(puVar8 + (ulong)bVar1 + 8) =
             iFreePage >> 0x18 | (iFreePage & 0xff0000) >> 8 | (iFreePage & 0xff00) << 8 |
             iFreePage << 0x18;
        goto LAB_00142408;
      }
    }
    iVar4 = 0x102a0;
  }
  iVar4 = sqlite3CorruptError(iVar4);
LAB_0014254b:
  local_5c = iVar4;
  releasePage(pPtrPage);
  if (iVar4 == 0) {
    ptrmapPut(local_58,iFreePage,eType,iPtrPage,&local_5c);
    iVar4 = local_5c;
  }
  return iVar4;
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 || 
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %d to free page %d (ptr page %d type %d)\n", 
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}